

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

SDKConnection * __thiscall MyClient::OnP2PConnectionStart(MyClient *this,TonkAddress *param_1)

{
  shared_ptr<MyP2PClientConnection> shared;
  undefined1 local_29;
  SDKConnection *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  MyClient *local_18;
  
  this->StartedP2PConnection = true;
  local_18 = this;
  std::__shared_ptr<MyP2PClientConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MyP2PClientConnection>,MyClient*>
            ((__shared_ptr<MyP2PClientConnection,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (allocator<MyP2PClientConnection> *)&local_29,&local_18);
  tonk::SDKConnectionList<MyP2PClientConnection>::Insert(&this->P2PClientList,local_28);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return local_28;
}

Assistant:

tonk::SDKConnection* MyClient::OnP2PConnectionStart(const TonkAddress& /*address*/)
{
    StartedP2PConnection = true;

    auto shared = std::make_shared<MyP2PClientConnection>(this);
    P2PClientList.Insert(shared.get());
    return shared.get();
}